

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

void copy_action(void)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  int lineno;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  FILE *__stream;
  bucket **ppbVar8;
  bool bVar9;
  int iVar10;
  char *line;
  char *line_00;
  union_tag *puVar11;
  ushort **ppuVar12;
  char *pcVar13;
  bucket *pbVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  char *local_98;
  
  __stream = action_file;
  lineno = input_file->lineno;
  line = dup_line();
  lVar22 = (long)cptr - (long)::line;
  if (last_was_action == '\x01') {
    insert_empty_rule();
  }
  last_was_action = 1;
  trialaction = *cptr == '[';
  fprintf((FILE *)__stream,"case %d:\n",(ulong)(nrules - 2));
  if (trialaction == '\0') {
    fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
  }
  if (lflag == '\0') {
    fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  if (*cptr == '=') {
    cptr = cptr + 1;
  }
  pbVar14 = pitem[(long)nitems + -1];
  bVar6 = true;
  if (pbVar14 == (bucket *)0x0) {
    iVar20 = 0;
    iVar23 = nitems;
  }
  else {
    lVar21 = 0;
    iVar19 = 0;
    do {
      iVar19 = iVar19 + (uint)(pbVar14->class != '\x04');
      pbVar14 = pitem[(long)nitems + lVar21 + -2];
      lVar21 = lVar21 + -1;
    } while (pbVar14 != (bucket *)0x0);
    iVar23 = nitems + (int)lVar21;
    iVar20 = -(int)lVar21;
    if (iVar19 != 0) {
      local_98 = allocate(iVar19 * 4 + 4);
      if (local_98 == (char *)0x0) {
        no_space();
        local_98 = (char *)0x0;
      }
      bVar6 = false;
      goto LAB_00115fad;
    }
  }
  iVar19 = 0;
  local_98 = (char *)0x0;
LAB_00115fad:
  ppbVar8 = pitem;
  if (iVar23 < nitems) {
    lVar15 = (long)iVar23;
    iVar18 = 0;
    iVar10 = nitems;
    do {
      iVar23 = iVar23 + 1;
      if (ppbVar8[lVar15]->class != '\x04') {
        lVar21 = (long)iVar18;
        iVar18 = iVar18 + 1;
        *(int *)(local_98 + lVar21 * 4 + 4) = iVar23 - iVar10;
        iVar10 = nitems;
      }
      lVar15 = lVar15 + 1;
      lVar21 = (long)iVar10;
    } while (lVar15 < lVar21);
  }
  else {
    lVar21 = (long)nitems;
  }
  do {
    iVar23 = 0;
    bVar9 = false;
LAB_00116030:
    do {
      bVar5 = bVar9;
      pcVar13 = cptr;
      cVar2 = *cptr;
      bVar9 = bVar5;
      if (cVar2 == '@') {
        cVar2 = cptr[1];
        if ((cVar2 == '@') || (cVar2 == '$')) {
          fprintf((FILE *)__stream,"%spos",symbol_prefix);
          cptr = cptr + 2;
          goto LAB_00116030;
        }
        ppuVar12 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 8) != 0) {
          cptr = pcVar13 + 1;
          iVar10 = get_number();
          if (iVar20 < iVar10) {
            at_warning(input_file->lineno,iVar10);
            uVar16 = iVar10 - iVar19;
          }
          else {
            uVar16 = *(uint *)(local_98 + (long)iVar10 * 4);
          }
          fprintf((FILE *)__stream,"%spsp[%d]",symbol_prefix,(ulong)uVar16);
          goto LAB_00116030;
        }
        if (cVar2 == '-') {
          cptr = pcVar13 + 2;
          iVar10 = get_number();
          fprintf((FILE *)__stream,"%spsp[%d]",symbol_prefix,(ulong)(uint)-(iVar20 + iVar10));
          goto LAB_00116030;
        }
        uVar17 = 0x40;
      }
      else if (cVar2 == '$') {
        cVar2 = cptr[1];
        if (cVar2 == '$') {
          if (havetags == 0) {
            fprintf((FILE *)__stream,"%sval",symbol_prefix);
          }
          else {
            if ((plhs[nrules]->tag == (union_tag *)0x0) ||
               (pcVar13 = plhs[nrules]->tag->name, pcVar13 == (char *)0x0)) {
              untyped_lhs();
              pcVar13 = (char *)0x0;
            }
            fprintf((FILE *)__stream,"%sval.%s",symbol_prefix,pcVar13);
          }
          cptr = cptr + 2;
          bVar9 = true;
          goto LAB_00116030;
        }
        if (cVar2 == '<') {
          iVar10 = input_file->lineno;
          line_00 = dup_line();
          lVar15 = (long)cptr - (long)::line;
          cptr = cptr + 1;
          puVar11 = get_tag(1);
          pcVar1 = cptr;
          pcVar13 = puVar11->name;
          cVar2 = *cptr;
          uVar16 = (uint)cVar2;
          uVar17 = (ulong)uVar16;
          if (uVar16 == 0x24) {
            fprintf((FILE *)__stream,"%sval.%s",symbol_prefix);
            cptr = cptr + 1;
LAB_001160e8:
            free(line_00);
          }
          else {
            ppuVar12 = __ctype_b_loc();
            uVar3 = (*ppuVar12)[(int)uVar16];
            if ((uVar3 >> 0xb & 1) == 0) {
              if ((cVar2 == '-') &&
                 ((*(byte *)((long)*ppuVar12 + (long)pcVar1[1] * 2 + 1) & 8) != 0)) {
                cptr = pcVar1 + 1;
                iVar10 = get_number();
                fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,
                        (ulong)(uint)-(iVar20 + iVar10),pcVar13);
                goto LAB_001160e8;
              }
              if ((cVar2 != '_') && ((uVar3 & 0x400) == 0)) {
                dollar_error(iVar10,line_00,line_00 + lVar15);
                goto LAB_0011613c;
              }
              puVar11 = get_tag(0);
              uVar16 = plhs[nrules]->args;
              uVar17 = (ulong)uVar16;
              do {
                iVar18 = (int)uVar17;
                if (iVar18 < 1) {
                  error(iVar10,line_00,line_00 + lVar15,"unknown argument %s");
                  uVar16 = plhs[nrules]->args;
                  break;
                }
                lVar7 = uVar17 - 1;
                uVar17 = uVar17 - 1;
              } while (puVar11->name != plhs[nrules]->argnames[lVar7]);
              fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,
                      (ulong)(iVar18 + (-iVar20 - uVar16)),pcVar13);
            }
            else {
              iVar18 = get_number();
              uVar16 = iVar18 - iVar19;
              if (uVar16 == 0 || iVar18 < iVar19) {
                uVar16 = *(uint *)(local_98 + (long)iVar18 * 4);
              }
              else {
                dollar_warning(iVar10,iVar18);
              }
              fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,(ulong)uVar16,pcVar13);
            }
            free(line_00);
          }
          goto LAB_00116030;
        }
        pcVar1 = cptr + 1;
        ppuVar12 = __ctype_b_loc();
        if (((*ppuVar12)[cVar2] >> 0xb & 1) != 0) {
          cptr = pcVar1;
          iVar10 = get_number();
          if (havetags == 0) {
            if (iVar20 < iVar10) {
              dollar_warning(input_file->lineno,iVar10);
              uVar16 = iVar10 - iVar19;
            }
            else {
              uVar16 = *(uint *)(local_98 + (long)iVar10 * 4);
            }
            fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,(ulong)uVar16);
          }
          else {
            if ((iVar10 < 1) || (iVar19 < iVar10)) {
              unknown_rhs(iVar10);
            }
            uVar17 = (ulong)*(int *)(local_98 + (long)iVar10 * 4);
            pbVar14 = ppbVar8[lVar21 + (uVar17 - 1)];
            puVar11 = pbVar14->tag;
            if ((puVar11 == (union_tag *)0x0) || (pcVar13 = puVar11->name, pcVar13 == (char *)0x0))
            {
              untyped_rhs(iVar10,pbVar14->name);
              uVar17 = (ulong)*(uint *)(local_98 + (long)iVar10 * 4);
              pcVar13 = (char *)0x0;
            }
            fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,uVar17,pcVar13);
          }
          goto LAB_00116030;
        }
        if (cVar2 == '-') {
          cptr = pcVar13 + 2;
          iVar10 = get_number();
          if (havetags != 0) {
            unknown_rhs(-iVar10);
          }
          fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,(ulong)(uint)-(iVar10 + iVar20));
          goto LAB_00116030;
        }
        if ((cVar2 == '_') || (((*ppuVar12)[cVar2] & 0x400) != 0)) {
          cptr = pcVar1;
          puVar11 = get_tag(0);
          pbVar14 = plhs[nrules];
          uVar16 = pbVar14->args;
          lVar15 = (ulong)uVar16 << 0x20;
          uVar17 = (ulong)uVar16;
          do {
            lVar15 = lVar15 + -0x100000000;
            iVar10 = (int)uVar17;
            if (iVar10 < 1) {
              error(input_file->lineno,::line,cptr,"unknown argument %s");
              pbVar14 = plhs[nrules];
              uVar16 = pbVar14->args;
              break;
            }
            lVar7 = uVar17 - 1;
            uVar17 = uVar17 - 1;
          } while (puVar11->name != pbVar14->argnames[lVar7]);
          lVar15 = *(long *)((long)pbVar14->argtags + (lVar15 >> 0x1d));
          fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,(ulong)(iVar10 + (-iVar20 - uVar16)));
          if (lVar15 == 0) {
            if (havetags != 0) {
              error(input_file->lineno,(char *)0x0,(char *)0x0,"untyped argument $%s");
            }
          }
          else {
            fprintf((FILE *)__stream,".%s",lVar15);
          }
          goto LAB_00116030;
        }
        uVar17 = 0x24;
      }
      else {
        uVar17 = (ulong)(uint)(int)cVar2;
        ppuVar12 = __ctype_b_loc();
      }
LAB_0011613c:
      iVar10 = (int)uVar17;
      if (((((*ppuVar12)[iVar10] >> 10 & 1) != 0) || (iVar10 == 0x5f)) || (iVar10 == 0x24)) {
        do {
          do {
            putc((int)uVar17,(FILE *)__stream);
            pcVar13 = cptr + 1;
            cVar2 = cptr[1];
            uVar17 = (ulong)cVar2;
            cptr = pcVar13;
          } while (((*ppuVar12)[uVar17] & 8) != 0);
        } while ((cVar2 == '$') || (cVar2 == '_'));
        goto LAB_00116030;
      }
      cptr = cptr + 1;
      if ((iVar10 == 0x5b && iVar23 == 0) && trialaction != '\0') {
        putc(0x7b,(FILE *)__stream);
        iVar23 = 1;
        goto LAB_00116030;
      }
      if ((iVar23 != 1 || iVar10 != 0x5d) || trialaction == '\0') {
        putc(iVar10,(FILE *)__stream);
        if (iVar10 < 0x3b) {
          if (iVar10 < 0x27) {
            if (iVar10 == 10) {
              get_line();
              if (::line == (char *)0x0) {
                unterminated_action(lineno,line,line + lVar22);
LAB_00116a0f:
                if (iVar23 < 1) {
                  fputc(10,(FILE *)__stream);
                  goto joined_r0x00116b53;
                }
              }
              goto LAB_00116030;
            }
            if (iVar10 != 0x22) goto LAB_00116030;
          }
          else if (iVar10 != 0x27) {
            if (iVar10 == 0x2f) {
              copy_comment(__stream,(FILE *)0x0);
            }
            goto LAB_00116030;
          }
          copy_string(iVar10,__stream,(FILE *)0x0);
          goto LAB_00116030;
        }
        if (iVar10 < 0x5d) {
          if (iVar10 == 0x3b) goto LAB_00116a0f;
          if (iVar10 != 0x5b) goto LAB_00116030;
        }
        else {
          if (iVar10 == 0x5d) {
            iVar23 = iVar23 + -1;
            goto LAB_00116030;
          }
          if (iVar10 != 0x7b) {
            if ((iVar10 == 0x7d) &&
               (iVar10 = iVar23 + -1, bVar4 = iVar23 < 2, iVar23 = iVar10, bVar4)) {
              iVar10 = nextc();
              if (iVar10 == 0x5b && !bVar5) {
                trialaction = '\x01';
              }
              else {
                fputc(10,(FILE *)__stream);
                if ((iVar10 != 0x7b) || (bVar5)) goto joined_r0x00116b53;
                if (lflag == '\0') {
                  fwrite("#\n",2,1,(FILE *)__stream);
                }
                fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
                bVar9 = false;
                if (lflag != '\0') goto LAB_00116030;
                fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,
                        input_file->name);
              }
              bVar9 = false;
            }
            goto LAB_00116030;
          }
        }
        iVar23 = iVar23 + 1;
        goto LAB_00116030;
      }
      putc(0x7d,(FILE *)__stream);
      iVar10 = nextc();
      iVar23 = 0;
      bVar9 = false;
    } while (iVar10 == 0x5b && !bVar5);
    fputc(10,(FILE *)__stream);
    if ((iVar10 != 0x7b) || (bVar5)) {
joined_r0x00116b53:
      if (lflag == '\0') {
        fwrite("#\n",2,1,(FILE *)__stream);
      }
      fwrite("break;\n",7,1,(FILE *)__stream);
      free(line);
      if (!bVar6) {
        free(local_98);
        return;
      }
      return;
    }
    if (lflag == '\0') {
      fwrite("#\n",2,1,(FILE *)__stream);
    }
    fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
    if (lflag == '\0') {
      fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
    }
    trialaction = '\0';
  } while( true );
}

Assistant:

void copy_action()
{
    register int c;
    register int i, j, n;
    int depth;
    int haveyyval = 0;
    char *tag;
    register FILE *f = action_file;
    int a_lineno = input_file->lineno;
    char *a_line = dup_line();
    char *a_cptr = a_line + (cptr - line);
    Yshort *offsets=0, maxoffset;
    bucket **rhs;

    if (last_was_action)
	insert_empty_rule();
    last_was_action = 1;
    trialaction = (*cptr == '[');

    fprintf(f, "case %d:\n", nrules - 2);
    if (!trialaction)
	fprintf(f, "  if (!%strial)\n", symbol_prefix);
    if (!lflag)
	fprintf(f, line_format, input_file->lineno, input_file->name);
    if (*cptr == '=') ++cptr;

    /* FIXME -- the argument offset table is computed independently in
     * FIXME -- several places (compile_arg, copy_action, and can_elide_arg)
     * FIXME -- those multiple implementations should be factored into
     * FIXME -- a single function. */
    maxoffset = n = 0;
    for (i = nitems - 1; pitem[i]; --i) {
	n++;
	if (pitem[i]->class != ARGUMENT)
	    maxoffset++; }
    if (maxoffset > 0) {
	offsets = NEW2(maxoffset+1, Yshort);
	if (offsets == 0) no_space(); }
    for (j=0, i++; i<nitems; i++)
	if (pitem[i]->class != ARGUMENT)
	    offsets[++j] = i - nitems + 1;
    rhs = pitem + nitems - 1;

    depth = 0;
loop:
    c = *cptr;
    if (c == '$') {
	if (cptr[1] == '<') {
	    int d_lineno = input_file->lineno;
	    char *d_line = dup_line();
	    char *d_cptr = d_line + (cptr - line);

	    ++cptr;
	    tag = get_tag(1)->name;
	    c = *cptr;
	    if (c == '$') {
		fprintf(f, "%sval.%s", symbol_prefix, tag);
		++cptr;
		FREE(d_line);
		goto loop; }
	    else if (isdigit(c)) {
		i = get_number();
		if (i > maxoffset) {
		    dollar_warning(d_lineno, i);
		    fprintf(f, "%svsp[%d].%s", symbol_prefix, i - maxoffset, tag); }
		else
		    fprintf(f, "%svsp[%d].%s", symbol_prefix, offsets[i], tag);
		FREE(d_line);
		goto loop; }
	    else if (c == '-' && isdigit(cptr[1])) {
		++cptr;
		i = -get_number() - n;
		fprintf(f, "%svsp[%d].%s", symbol_prefix, i, tag);
		FREE(d_line);
		goto loop; }
	    else if (isalpha(c) || c == '_') {
		char *arg = get_tag(0)->name;
		for (i=plhs[nrules]->args-1; i>=0; i--)
		    if (arg == plhs[nrules]->argnames[i]) break;
		if (i<0)
		    error(d_lineno,d_line,d_cptr,"unknown argument %s",arg);
		fprintf(f, "%svsp[%d].%s", symbol_prefix, i-plhs[nrules]->args+1-n, tag);
		FREE(d_line);
		goto loop; }
	    else
		dollar_error(d_lineno, d_line, d_cptr); }
	else if (cptr[1] == '$') {
	    if (havetags) {
		tag = plhs[nrules]->tag ? plhs[nrules]->tag->name : 0;
		if (tag == 0) untyped_lhs();
		fprintf(f, "%sval.%s", symbol_prefix, tag); }
	    else
		fprintf(f, "%sval", symbol_prefix);
	    cptr += 2;
	    haveyyval = 1;
	    goto loop; }
	else if (isdigit(cptr[1])) {
	    ++cptr;
	    i = get_number();
	    if (havetags) {
		if (i <= 0 || i > maxoffset)
		    unknown_rhs(i);
		tag = rhs[offsets[i]]->tag ? rhs[offsets[i]]->tag->name : 0;
		if (tag == 0)
		    untyped_rhs(i, rhs[offsets[i]]->name);
		fprintf(f, "%svsp[%d].%s", symbol_prefix, offsets[i], tag); }
	    else {
		if (i > n) {
		    dollar_warning(input_file->lineno, i);
		    fprintf(f, "%svsp[%d]", symbol_prefix, i - maxoffset); }
		else
		    fprintf(f, "%svsp[%d]", symbol_prefix, offsets[i]); }
	    goto loop; }
	else if (cptr[1] == '-') {
	    cptr += 2;
	    i = get_number();
	    if (havetags)
		unknown_rhs(-i);
	    fprintf(f, "%svsp[%d]", symbol_prefix, -i - n);
	    goto loop; }
	else if (isalpha(cptr[1]) || cptr[1] == '_') {
	    char *arg;
	    ++cptr;
	    arg = get_tag(0)->name;
	    for (i=plhs[nrules]->args-1; i>=0; i--)
		if (arg == plhs[nrules]->argnames[i]) break;
	    if (i<0)
		error(input_file->lineno, line, cptr, "unknown argument %s", arg);
	    tag = plhs[nrules]->argtags[i];
	    fprintf(f, "%svsp[%d]", symbol_prefix, i - plhs[nrules]->args + 1 - n);
	    if (tag) fprintf(f, ".%s", tag);
	    else if (havetags)
		error(input_file->lineno, 0, 0, "untyped argument $%s", arg);
	    goto loop; }
    } else if (c == '@') {
	if (cptr[1] == '@' || cptr[1] == '$') {
	    fprintf(f, "%spos", symbol_prefix);
	    cptr += 2;
	    goto loop; }
	else if (isdigit(cptr[1])) {
	    ++cptr;
	    i = get_number();
	    if (i > n) {
		at_warning(input_file->lineno, i);
		fprintf(f, "%spsp[%d]", symbol_prefix, i - maxoffset); }
	    else
		fprintf(f, "%spsp[%d]", symbol_prefix, offsets[i]);
	    goto loop; }
	else if (cptr[1] == '-') {
	    cptr += 2;
	    i = get_number();
	    fprintf(f, "%spsp[%d]", symbol_prefix, -i - n);
	    goto loop; } }
    if (isalpha(c) || c == '_' || c == '$') {
	do {
	    putc(c, f);
	    c = *++cptr;
	} while (isalnum(c) || c == '_' || c == '$');
	goto loop; }
    ++cptr;
    if (trialaction && c == '[' && depth == 0) {
	++depth;
	putc('{', f);
	goto loop; }
    if (trialaction && c == ']' && depth == 1) {
	--depth;
	putc('}', f);
	c = nextc();
	if (c == '[' && !haveyyval) {
	    goto loop; }
	else if (c == '{' && !haveyyval) {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "  if (!%strial)\n", symbol_prefix);
	    if (!lflag)
		fprintf(f, line_format, input_file->lineno, input_file->name);
	    trialaction = 0;
	    goto loop; }
	else {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "break;\n");
	    FREE(a_line);
	    if (maxoffset > 0) FREE(offsets);
	    return; } }
    putc(c, f);
    switch (c) {
    case '\n':
	get_line();
	if (line) goto loop;
	unterminated_action(a_lineno, a_line, a_cptr);
    case ';':
	if (depth > 0) goto loop;
	fprintf(f, "\n");
	if (!lflag) fprintf(f, "#\n");
	fprintf(f, "break;\n");
	FREE(a_line);
	if (maxoffset > 0) FREE(offsets);
	return;
    case '[':
	++depth;
	goto loop;
    case ']':
	--depth;
	goto loop;
    case '{':
	++depth;
	goto loop;
    case '}':
	if (--depth > 0) goto loop;
	c = nextc();
	if (c == '[' && !haveyyval) {
	    trialaction = 1;
	    goto loop; }
	else if (c == '{' && !haveyyval) {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "  if (!%strial)\n", symbol_prefix);
	    if (!lflag)
		fprintf(f, line_format, input_file->lineno, input_file->name);
	    goto loop; }
	else {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "break;\n");
	    FREE(a_line);
	    if (maxoffset > 0) FREE(offsets);
	    return; }
    case '\'':
    case '"':
	copy_string(c, f, 0);
	goto loop;
    case '/':
	copy_comment(f, 0);
	goto loop;
    default:
	goto loop; }
}